

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

void __thiscall QObject::killTimer(QObject *this,TimerId id)

{
  long lVar1;
  QObjectData *pQVar2;
  _func_int **pp_Var3;
  QObject *pQVar4;
  int iVar5;
  QThread *pQVar6;
  undefined4 extraout_var;
  char *pcVar7;
  ushort *puVar8;
  QThread *pQVar9;
  long in_FS_OFFSET;
  QString QStack_68;
  QMessageLogger local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d_ptr).d;
  pQVar9 = (QThread *)pQVar2[1].q_ptr[5]._vptr_QObject;
  pQVar6 = QThread::currentThread();
  if (pQVar6 == pQVar9) {
    if (0 < (int)id) {
      pp_Var3 = pQVar2[1]._vptr_QObjectData;
      if (pp_Var3 == (_func_int **)0x0) {
        iVar5 = -1;
      }
      else {
        if (pp_Var3[8] != (_func_int *)0x0) {
          pQVar6 = (QThread *)0xfffffffffffffffc;
          do {
            iVar5 = (int)pQVar9;
            lVar1 = (long)pp_Var3[8] * -4 + (long)pQVar6;
            if (lVar1 == -4) goto LAB_002b59d5;
            pQVar9 = (QThread *)((long)&(pQVar6->super_QObject)._vptr_QObject + 4);
            pQVar4 = &pQVar6->super_QObject;
            pQVar6 = pQVar9;
          } while (*(TimerId *)(pp_Var3[7] + 4 + (long)&pQVar4->_vptr_QObject) != id);
          iVar5 = (int)((long)pQVar9 >> 2);
LAB_002b59d5:
          if (lVar1 != -4) goto LAB_002b59ea;
        }
        iVar5 = -1;
      }
LAB_002b59ea:
      if (iVar5 != -1) {
        if (pQVar2[1].q_ptr[6]._vptr_QObject != (_func_int **)0x0) {
          QAbstractEventDispatcher::unregisterTimer
                    ((QAbstractEventDispatcher *)pQVar2[1].q_ptr[6]._vptr_QObject,id);
        }
        pp_Var3 = pQVar2[1]._vptr_QObjectData;
        if ((pp_Var3[6] == (_func_int *)0x0) || (1 < *(int *)pp_Var3[6])) {
          QArrayDataPointer<Qt::TimerId>::reallocateAndGrow
                    ((QArrayDataPointer<Qt::TimerId> *)(pp_Var3 + 6),GrowsAtEnd,0,
                     (QArrayDataPointer<Qt::TimerId> *)0x0);
        }
        QtPrivate::QPodArrayOps<Qt::TimerId>::erase
                  ((QPodArrayOps<Qt::TimerId> *)(pp_Var3 + 6),
                   (TimerId *)(pp_Var3[7] + (long)iVar5 * 4),1);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          QAbstractEventDispatcherPrivate::releaseTimerId(id);
          return;
        }
        goto LAB_002b5b42;
      }
      local_50.context.version = 2;
      local_50.context._4_8_ = 0;
      local_50.context._12_8_ = 0;
      local_50.context.function._4_4_ = 0;
      local_50.context.category = "default";
      iVar5 = (**this->_vptr_QObject)(this);
      pcVar7 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar5));
      objectName(&QStack_68,this);
      puVar8 = QString::utf16(&QStack_68);
      QMessageLogger::warning
                (&local_50,
                 "QObject::killTimer(): Error: timer id %d is not valid for object %p (%s, %ls), timer has not been killed"
                 ,id,this,pcVar7,puVar8);
      killTimer((QObject *)&QStack_68);
    }
  }
  else {
    killTimer();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_002b5b42:
  __stack_chk_fail();
}

Assistant:

void QObject::killTimer(Qt::TimerId id)
{
    Q_D(QObject);
    if (Q_UNLIKELY(thread() != QThread::currentThread())) {
        qWarning("QObject::killTimer: Timers cannot be stopped from another thread");
        return;
    }
    if (id > Qt::TimerId::Invalid) {
        int at = d->extraData ? d->extraData->runningTimers.indexOf(id) : -1;
        if (at == -1) {
            // timer isn't owned by this object
            qWarning("QObject::killTimer(): Error: timer id %d is not valid for object %p (%s, %ls), timer has not been killed",
                     qToUnderlying(id),
                     this,
                     metaObject()->className(),
                     qUtf16Printable(objectName()));
            return;
        }

        auto thisThreadData = d->threadData.loadRelaxed();
        if (thisThreadData->hasEventDispatcher())
            thisThreadData->eventDispatcher.loadRelaxed()->unregisterTimer(id);

        d->extraData->runningTimers.remove(at);
        QAbstractEventDispatcherPrivate::releaseTimerId(id);
    }
}